

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

ResetOrderMap * __thiscall
libcellml::Validator::ValidatorImpl::buildModelResetOrderMap
          (ResetOrderMap *__return_storage_ptr__,ValidatorImpl *this,ModelPtr *model)

{
  element_type *peVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  ComponentPtr component;
  ulong local_30;
  size_t i;
  ModelPtr *model_local;
  ValidatorImpl *this_local;
  ResetOrderMap *resetOrderMap;
  
  std::
  map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(__return_storage_ptr__);
  local_30 = 0;
  while( true ) {
    peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    sVar2 = ComponentEntity::componentCount(&peVar1->super_ComponentEntity);
    if (sVar2 <= local_30) break;
    peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    ComponentEntity::component((ComponentEntity *)local_50,(size_t)peVar1);
    traverseComponentTree(this,(ComponentPtr *)local_50,__return_storage_ptr__);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_50)
    ;
    local_30 = local_30 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ResetOrderMap Validator::ValidatorImpl::buildModelResetOrderMap(const ModelPtr &model)
{
    ResetOrderMap resetOrderMap;
    for (size_t i = 0; i < model->componentCount(); ++i) {
        auto component = model->component(i);
        traverseComponentTree(component, resetOrderMap);
    }

    return resetOrderMap;
}